

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O3

void chrono::
     _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>>
               (list<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                *contactlist,ReportContactCallback *mcallback)

{
  long *plVar1;
  int iVar2;
  _List_node_base *p_Var3;
  long local_58;
  long local_50;
  undefined1 local_48 [24];
  
  p_Var3 = (_List_node_base *)contactlist;
  do {
    p_Var3 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)contactlist) {
      return;
    }
    plVar1 = (long *)p_Var3[1]._M_next;
    local_50 = plVar1[0x16];
    local_58 = plVar1[0x17];
    (**(code **)(*plVar1 + 0x10))(local_48);
    iVar2 = (*mcallback->_vptr_ReportContactCallback[2])
                      (mcallback,plVar1 + 4,plVar1 + 7,plVar1 + 0xd,&local_50,&local_58,local_48,
                       &VNULL,*(undefined8 *)((long)p_Var3[1]._M_next + 0x10),
                       *(undefined8 *)((long)p_Var3[1]._M_next + 0x18));
  } while ((char)iVar2 != '\0');
  return;
}

Assistant:

void _ReportAllContacts(std::list<Tcont*>& contactlist, ChContactContainer::ReportContactCallback* mcallback) {
    typename std::list<Tcont*>::iterator itercontact = contactlist.begin();
    while (itercontact != contactlist.end()) {
        bool proceed = mcallback->OnReportContact(
            (*itercontact)->GetContactP1(), (*itercontact)->GetContactP2(), (*itercontact)->GetContactPlane(),
            (*itercontact)->GetContactDistance(), (*itercontact)->GetEffectiveCurvatureRadius(),
            (*itercontact)->GetContactForce(), VNULL, (*itercontact)->GetObjA(), (*itercontact)->GetObjB());
        if (!proceed)
            break;
        ++itercontact;
    }
}